

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * duckdb_fmt::v6::internal::write_exponent<char,_char_*>(int exp,char *it)

{
  long lVar1;
  char *d;
  char *top;
  char *it_local;
  int exp_local;
  
  if (exp < 0) {
    *it = '-';
    exp_local = -exp;
  }
  else {
    *it = '+';
    exp_local = exp;
  }
  it_local = it + 1;
  if (99 < exp_local) {
    lVar1 = (long)(exp_local / 100 << 1);
    if (999 < exp_local) {
      *it_local = basic_data<void>::digits[lVar1];
      it_local = it + 2;
    }
    *it_local = basic_data<void>::digits[lVar1 + 1];
    exp_local = exp_local % 100;
    it_local = it_local + 1;
  }
  *it_local = basic_data<void>::digits[exp_local << 1];
  it_local[1] = basic_data<void>::digits[(long)(exp_local << 1) + 1];
  return it_local + 2;
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits + (exp / 100) * 2;
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits + exp * 2;
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}